

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall
Json::Value::setComment(Value *this,char *comment,size_t len,CommentPlacement placement)

{
  undefined8 *puVar1;
  long in_RDI;
  size_t in_stack_00000170;
  char *in_stack_00000178;
  CommentInfo *in_stack_00000180;
  CommentInfo *local_40;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    local_40 = (CommentInfo *)(puVar1 + 1);
    do {
      CommentInfo::CommentInfo(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != (CommentInfo *)(puVar1 + 4));
    *(CommentInfo **)(in_RDI + 0x10) = (CommentInfo *)(puVar1 + 1);
  }
  CommentInfo::setComment(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  return;
}

Assistant:

void Value::setComment(const char* comment, size_t len, CommentPlacement placement) {
  if (!comments_)
    comments_ = new CommentInfo[numberOfCommentPlacement];
  if ((len > 0) && (comment[len-1] == '\n')) {
    // Always discard trailing newline, to aid indentation.
    len -= 1;
  }
  comments_[placement].setComment(comment, len);
}